

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void prepare_tf_workers(AV1_COMP *cpi,AVxWorkerHook hook,int num_workers,int is_highbitdepth)

{
  _Bool _Var1;
  long lVar2;
  TemporalFilterData *tf_data;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  EncWorkerData *thread_data;
  AVxWorker *worker;
  int i;
  MultiThreadInfo *mt_info;
  int local_24;
  
  *(undefined4 *)(in_RDI + 0x9d188) = 0;
  *(undefined1 *)(in_RDI + 0x9d18c) = 0;
  for (local_24 = in_EDX + -1; -1 < local_24; local_24 = local_24 + -1) {
    lVar2 = *(long *)(in_RDI + 0x9ae80) + (long)local_24 * 0x38;
    tf_data = (TemporalFilterData *)(*(long *)(in_RDI + 0x9ae88) + (long)local_24 * 0x1d0);
    *(undefined8 *)(lVar2 + 0x18) = in_RSI;
    *(TemporalFilterData **)(lVar2 + 0x20) = tf_data;
    *(undefined8 *)(lVar2 + 0x28) = 0;
    *(int *)((long)&tf_data[9].accum + 4) = local_24;
    *(int *)&tf_data[9].accum = local_24;
    (tf_data->diff).sum = in_RDI;
    if (local_24 == 0) {
      (tf_data->diff).sse = in_RDI + 0x15030;
    }
    else {
      (tf_data->diff).sse = (int64_t)tf_data->tmp_mbmi;
    }
    if ((tf_data->diff).sse != in_RDI + 0x15030) {
      memcpy((void *)(tf_data->diff).sse,(void *)(in_RDI + 0x15030),0x256b0);
      av1_init_obmc_buffer((OBMCBuffer *)((tf_data->diff).sse + 0x41a0));
      _Var1 = tf_alloc_and_reset_data(tf_data,0,0x254588);
      if (!_Var1) {
        aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3bfb0),AOM_CODEC_MEM_ERROR,
                           "Error allocating temporal filter data");
      }
    }
  }
  return;
}

Assistant:

static void prepare_tf_workers(AV1_COMP *cpi, AVxWorkerHook hook,
                               int num_workers, int is_highbitdepth) {
  MultiThreadInfo *mt_info = &cpi->mt_info;
  mt_info->tf_sync.next_tf_row = 0;
  mt_info->tf_sync.tf_mt_exit = false;
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *worker = &mt_info->workers[i];
    EncWorkerData *thread_data = &mt_info->tile_thr_data[i];

    worker->hook = hook;
    worker->data1 = thread_data;
    worker->data2 = NULL;

    thread_data->thread_id = i;
    // Set the starting tile for each thread.
    thread_data->start = i;

    thread_data->cpi = cpi;
    if (i == 0) {
      thread_data->td = &cpi->td;
    } else {
      thread_data->td = thread_data->original_td;
    }

    // Before encoding a frame, copy the thread data from cpi.
    if (thread_data->td != &cpi->td) {
      thread_data->td->mb = cpi->td.mb;
      // OBMC buffers are used only to init MS params and remain unused when
      // called from tf, hence set the buffers to defaults.
      av1_init_obmc_buffer(&thread_data->td->mb.obmc_buffer);
      if (!tf_alloc_and_reset_data(&thread_data->td->tf_data,
                                   cpi->tf_ctx.num_pels, is_highbitdepth)) {
        aom_internal_error(cpi->common.error, AOM_CODEC_MEM_ERROR,
                           "Error allocating temporal filter data");
      }
    }
  }
}